

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

ControlInfo * BuildControl(SstStream Stream,FMFormat Format)

{
  long lVar1;
  int iVar2;
  long lVar3;
  ControlStruct *pCVar4;
  FFSVarRec_conflict pFVar5;
  FMFormat in_RSI;
  long in_RDI;
  int Type_1;
  FFSVarRec_conflict VarRec_1;
  char *FieldName;
  int ElementSize;
  FFSVarRec_conflict VarRec;
  int Type;
  char *ArrayName;
  ControlStruct *C;
  ControlInfo *ret;
  int ControlCount;
  int i;
  FMFieldList FieldList;
  FMStructDescList FormatList;
  FFSReaderMarshalBase *Info;
  uint in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  FFSVarRec_conflict in_stack_ffffffffffffff90;
  SstStream in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  void *local_48;
  ControlInfo *local_38;
  int local_30;
  int local_2c;
  long *local_28;
  
  lVar1 = *(long *)(in_RDI + 0x300);
  lVar3 = format_list_of_FMFormat(in_RSI);
  local_28 = *(long **)(lVar3 + 8);
  while (iVar2 = strncmp((char *)*local_28,"BitField",8), iVar2 == 0) {
    local_28 = local_28 + 3;
  }
  while( true ) {
    in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 & 0xffffff;
    if (*local_28 != 0) {
      iVar2 = strncmp((char *)*local_28,"DataBlockSize",8);
      in_stack_ffffffffffffff88 = CONCAT13(iVar2 == 0,(int3)in_stack_ffffffffffffff88);
    }
    if ((char)(in_stack_ffffffffffffff88 >> 0x18) == '\0') break;
    local_28 = local_28 + 3;
  }
  local_2c = 0;
  local_30 = 0;
  local_38 = (ControlInfo *)malloc(0x38);
  local_38->Format = in_RSI;
  while (local_28[(long)local_2c * 3] != 0) {
    local_38 = (ControlInfo *)realloc(local_38,(long)local_30 * 0x38 + 0x38);
    pCVar4 = local_38->Controls + local_30;
    local_30 = local_30 + 1;
    pCVar4->FieldIndex = local_2c;
    pCVar4->FieldOffset = *(int *)((long)local_28 + (long)local_2c * 0x18 + 0x14);
    iVar2 = NameIndicatesArray((char *)in_stack_ffffffffffffff90);
    if (iVar2 == 0) {
      in_stack_ffffffffffffff98 = (SstStream)strdup((char *)(local_28[(long)local_2c * 3] + 4));
      pCVar4->IsArray = 0;
      in_stack_ffffffffffffff90 = LookupVarByName(in_stack_ffffffffffffff98,(char *)0x0);
      if (in_stack_ffffffffffffff90 == (FFSVarRec_conflict)0x0) {
        in_stack_ffffffffffffff8c =
             TranslateFFSType2ADIOS
                       ((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
        in_stack_ffffffffffffff90 =
             CreateVarRec((SstStream)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (char *)in_stack_ffffffffffffff98);
        in_stack_ffffffffffffff90->DimCount = 0;
        pCVar4->Type = in_stack_ffffffffffffff8c;
        in_stack_ffffffffffffff90->Type = in_stack_ffffffffffffff8c;
      }
      in_stack_ffffffffffffff90->ElementSize = (int)local_28[(long)local_2c * 3 + 2];
      pCVar4->ElementSize = (int)local_28[(long)local_2c * 3 + 2];
      pCVar4->VarRec = in_stack_ffffffffffffff90;
      free(in_stack_ffffffffffffff98);
      local_2c = local_2c + 1;
    }
    else {
      pCVar4->IsArray = 1;
      BreakdownArrayName((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (char **)0x0,
                         (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int *)in_stack_ffffffffffffff98);
      pFVar5 = LookupVarByName(in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90);
      if (pFVar5 == (FFSVarRec_conflict)0x0) {
        pFVar5 = CreateVarRec((SstStream)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (char *)in_stack_ffffffffffffff98);
        pFVar5->Type = in_stack_ffffffffffffffb4;
        pFVar5->ElementSize = in_stack_ffffffffffffffa4;
        pCVar4->ElementSize = in_stack_ffffffffffffffa4;
      }
      local_2c = local_2c + 5;
      free(local_48);
      pCVar4->VarRec = pFVar5;
    }
  }
  local_38->ControlCount = local_30;
  local_38->Next = *(ControlInfo **)(lVar1 + 0x48);
  *(ControlInfo **)(lVar1 + 0x48) = local_38;
  return local_38;
}

Assistant:

static struct ControlInfo *BuildControl(SstStream Stream, FMFormat Format)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    FMStructDescList FormatList = format_list_of_FMFormat(Format);
    FMFieldList FieldList = FormatList[0].field_list;
    while (strncmp(FieldList->field_name, "BitField", 8) == 0)
        FieldList++;
    while (FieldList->field_name && (strncmp(FieldList->field_name, "DataBlockSize", 8) == 0))
        FieldList++;
    int i = 0;
    int ControlCount = 0;
    struct ControlInfo *ret = malloc(sizeof(*ret));
    ret->Format = Format;
    while (FieldList[i].field_name)
    {
        ret = realloc(ret, sizeof(*ret) + ControlCount * sizeof(struct ControlInfo));
        struct ControlStruct *C = &(ret->Controls[ControlCount]);
        ControlCount++;

        C->FieldIndex = i;
        C->FieldOffset = FieldList[i].field_offset;

        if (NameIndicatesArray(FieldList[i].field_name))
        {
            char *ArrayName;
            int Type;
            FFSVarRec VarRec = NULL;
            int ElementSize;
            C->IsArray = 1;
            BreakdownArrayName(FieldList[i].field_name, &ArrayName, &Type, &ElementSize);
            //            if (WriterRank != 0)
            //            {
            VarRec = LookupVarByName(Stream, ArrayName);
            //            }
            if (!VarRec)
            {
                VarRec = CreateVarRec(Stream, ArrayName);
                VarRec->Type = Type;
                VarRec->ElementSize = ElementSize;
                C->ElementSize = ElementSize;
            }
            i += 5; // number of fields in MetaArrayRec
            free(ArrayName);
            C->VarRec = VarRec;
        }
        else
        {
            /* simple field */
            char *FieldName = strdup(FieldList[i].field_name + 4); // skip SST_
            FFSVarRec VarRec = NULL;
            C->IsArray = 0;
            VarRec = LookupVarByName(Stream, FieldName);
            if (!VarRec)
            {
                int Type = TranslateFFSType2ADIOS(FieldList[i].field_type, FieldList[i].field_size);
                VarRec = CreateVarRec(Stream, FieldName);
                VarRec->DimCount = 0;
                C->Type = Type;
                VarRec->Type = Type;
            }
            VarRec->ElementSize = FieldList[i].field_size;
            C->ElementSize = FieldList[i].field_size;
            C->VarRec = VarRec;
            free(FieldName);
            i++;
        }
    }
    ret->ControlCount = ControlCount;
    ret->Next = Info->ControlBlocks;
    Info->ControlBlocks = ret;
    return ret;
}